

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O3

WavFileWriter * __thiscall
WavFileWriter::OpenWrite
          (WavFileWriter *this,AudioDescriptor *ADesc,char *file_root,SplitType_t split)

{
  uint uVar1;
  double dVar2;
  Rational RVar3;
  Rational RVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  WavFileElement *pWVar12;
  _List_node_base *p_Var13;
  size_t sVar14;
  ILogSink *this_00;
  undefined4 in_register_0000000c;
  char *pcVar15;
  undefined1 *puVar16;
  ui32_t in_R8D;
  ulong uVar17;
  uint uVar18;
  AudioDescriptor tmpDesc;
  Result_t result;
  SimpleRF64Header Wav;
  char filename [1024];
  AudioDescriptor local_568;
  AudioDescriptor *local_538;
  char *local_530;
  int local_528 [26];
  string local_4c0 [104];
  SimpleRF64Header local_458 [32];
  char local_438 [1032];
  
  pcVar15 = (char *)CONCAT44(in_register_0000000c,split);
  if (pcVar15 == (char *)0x0) {
    puVar16 = Kumu::RESULT_PTR;
LAB_00111943:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar16);
    return this;
  }
  if (*pcVar15 == '\0') {
    puVar16 = Kumu::RESULT_NULL_STR;
    goto LAB_00111943;
  }
  Kumu::Result_t::Result_t((Result_t *)local_528,(Result_t *)Kumu::RESULT_OK);
  RVar3 = *(Rational *)file_root;
  RVar4 = *(Rational *)(file_root + 8);
  uVar5 = *(undefined8 *)(file_root + 0x10);
  uVar6 = *(undefined8 *)(file_root + 0x18);
  uVar7 = *(undefined8 *)(file_root + 0x20);
  uVar8 = *(undefined8 *)(file_root + 0x28);
  ADesc->AvgBps = (int)uVar7;
  ADesc->LinkedTrackID = (int)((ulong)uVar7 >> 0x20);
  ADesc->ContainerDuration = (int)uVar8;
  ADesc->ChannelFormat = (int)((ulong)uVar8 >> 0x20);
  ADesc->Locked = (int)uVar5;
  ADesc->ChannelCount = (int)((ulong)uVar5 >> 0x20);
  ADesc->QuantizationBits = (int)uVar6;
  ADesc->BlockAlign = (int)((ulong)uVar6 >> 0x20);
  ADesc->EditRate = RVar3;
  ADesc->AudioSamplingRate = RVar4;
  if (in_R8D == 0) {
    uVar11 = ADesc->ChannelCount;
    ADesc[1].QuantizationBits = uVar11;
    uVar18 = 1;
    uVar1 = uVar11;
  }
  else {
    if (in_R8D == 2) {
      uVar11 = ADesc->ChannelCount;
      if ((uVar11 & 1) != 0) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (this_00,"Unable to create 2-channel splits with odd number of input channels.\n")
        ;
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
        goto LAB_00111cf9;
      }
      uVar18 = uVar11 >> 1;
    }
    else {
      if (in_R8D != 1) goto LAB_00111b73;
      uVar11 = ADesc->ChannelCount;
      uVar18 = uVar11;
    }
    ADesc[1].QuantizationBits = in_R8D;
    uVar1 = uVar18;
  }
  if (uVar1 == 0) {
LAB_00111b73:
    __assert_fail("file_count && m_ChannelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/WavFileWriter.h"
                  ,0x89,
                  "ASDCP::Result_t WavFileWriter::OpenWrite(ASDCP::PCM::AudioDescriptor &, const char *, SplitType_t)"
                 );
  }
  uVar1 = ADesc->QuantizationBits;
  dVar2 = ceil(((double)(ADesc->AudioSamplingRate).Numerator /
               (double)(ADesc->AudioSamplingRate).Denominator) /
               ((double)(ADesc->EditRate).Numerator / (double)(ADesc->EditRate).Denominator));
  uVar11 = ((int)(long)dVar2 * (uVar1 >> 3) * uVar11) / uVar18;
  if (in_R8D == 0) {
    snprintf(local_438,0x400,"%s",pcVar15);
    pWVar12 = (WavFileElement *)operator_new(0x68);
    WavFileElement::WavFileElement(pWVar12,uVar11);
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)pWVar12;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    *(long *)&ADesc[1].Locked = *(long *)&ADesc[1].Locked + 1;
    local_568.EditRate = (Rational)&local_568.Locked;
    sVar14 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_568,local_438,local_438 + sVar14);
    Kumu::FileWriter::OpenWrite(local_4c0);
    Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
    Kumu::Result_t::~Result_t((Result_t *)local_4c0);
    if (local_568.EditRate != (Rational)&local_568.Locked) {
      operator_delete((void *)local_568.EditRate,local_568._16_8_ + 1);
    }
    if (-1 < local_528[0]) {
      local_568.EditRate = ADesc->EditRate;
      local_568.AudioSamplingRate = ADesc->AudioSamplingRate;
      uVar10 = ADesc->Locked;
      local_568.QuantizationBits = ADesc->QuantizationBits;
      local_568.BlockAlign = ADesc->BlockAlign;
      local_568.AvgBps = ADesc->AvgBps;
      local_568.LinkedTrackID = ADesc->LinkedTrackID;
      local_568.ContainerDuration = ADesc->ContainerDuration;
      local_568.ChannelFormat = ADesc->ChannelFormat;
      local_568.ChannelCount = ADesc[1].QuantizationBits;
      local_568.Locked = uVar10;
      ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_458,&local_568);
      ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_4c0);
      Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
      Kumu::Result_t::~Result_t((Result_t *)local_4c0);
    }
  }
  else {
    local_530 = pcVar15;
    if (-1 < local_528[0]) {
      local_538 = ADesc + 1;
      uVar17 = 1;
      while( true ) {
        snprintf(local_438,0x400,"%s_%02u.wav",local_530,uVar17);
        pWVar12 = (WavFileElement *)operator_new(0x68);
        WavFileElement::WavFileElement(pWVar12,uVar11);
        p_Var13 = (_List_node_base *)operator_new(0x18);
        p_Var13[1]._M_next = (_List_node_base *)pWVar12;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        *(long *)&ADesc[1].Locked = *(long *)&ADesc[1].Locked + 1;
        local_568.EditRate = (Rational)&local_568.Locked;
        sVar14 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_568,local_438,local_438 + sVar14);
        Kumu::FileWriter::OpenWrite(local_4c0);
        Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
        Kumu::Result_t::~Result_t((Result_t *)local_4c0);
        if (local_568.EditRate != (Rational)&local_568.Locked) {
          operator_delete((void *)local_568.EditRate,local_568._16_8_ + 1);
        }
        if (local_528[0] < 0) break;
        local_568.EditRate = ADesc->EditRate;
        local_568.AudioSamplingRate = ADesc->AudioSamplingRate;
        uVar9 = ADesc->Locked;
        local_568.QuantizationBits = ADesc->QuantizationBits;
        local_568.BlockAlign = ADesc->BlockAlign;
        local_568.AvgBps = ADesc->AvgBps;
        local_568.LinkedTrackID = ADesc->LinkedTrackID;
        local_568.ContainerDuration = ADesc->ContainerDuration;
        local_568.ChannelFormat = ADesc->ChannelFormat;
        local_568.ChannelCount = ADesc[1].QuantizationBits;
        local_568.Locked = uVar9;
        ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_458,&local_568);
        ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_4c0);
        Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
        Kumu::Result_t::~Result_t((Result_t *)local_4c0);
        if ((uVar18 <= (uint)uVar17) || (uVar17 = (ulong)((uint)uVar17 + 1), local_528[0] < 0))
        break;
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_528);
LAB_00111cf9:
  Kumu::Result_t::~Result_t((Result_t *)local_528);
  return this;
}

Assistant:

ASDCP::Result_t
    OpenWrite(ASDCP::PCM::AudioDescriptor &ADesc, const char* file_root, SplitType_t split = ST_NONE)
    {
      ASDCP_TEST_NULL_STR(file_root);
      char filename[Kumu::MaxFilePath];
      ui32_t file_count = 0;
      ASDCP::Result_t result = ASDCP::RESULT_OK;
      m_ADesc = ADesc;

      switch ( split )
	{
	case ST_NONE:
	  file_count = 1;
	  m_ChannelCount = m_ADesc.ChannelCount;
	  break;

	case ST_MONO:
	  file_count = m_ADesc.ChannelCount;
	  m_ChannelCount = 1;
	  break;

	case ST_STEREO:
	  if ( m_ADesc.ChannelCount % 2 != 0 )
	    {
	      Kumu::DefaultLogSink().Error("Unable to create 2-channel splits with odd number of input channels.\n");
	      return ASDCP::RESULT_PARAM;
	    }

	  file_count = m_ADesc.ChannelCount / 2;
	  m_ChannelCount = 2;
	  break;
	}
      assert(file_count && m_ChannelCount);

      ui32_t element_size = ASDCP::PCM::CalcFrameBufferSize(m_ADesc) / file_count;
      if (split == ST_NONE)
      {
          snprintf(filename, Kumu::MaxFilePath, "%s", file_root);
          m_OutFile.push_back(new WavFileElement(element_size));
          result = m_OutFile.back()->OpenWrite(filename);
          if ( ASDCP_SUCCESS(result) )
          {
              ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
              tmpDesc.ChannelCount = m_ChannelCount;
              ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
              result = Wav.WriteToFile(*(m_OutFile.back()));
          }
      }
      else
      {
          for ( ui32_t i = 0; i < file_count && ASDCP_SUCCESS(result); i++ )
          {
              snprintf(filename, Kumu::MaxFilePath, "%s_%02u.wav", file_root, (i + 1));
              m_OutFile.push_back(new WavFileElement(element_size));
              result = m_OutFile.back()->OpenWrite(filename);

              if ( ASDCP_SUCCESS(result) )
              {
                  ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
                  tmpDesc.ChannelCount = m_ChannelCount;
                  ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
                  result = Wav.WriteToFile(*(m_OutFile.back()));
              }
          }
      }
      return result;
    }